

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void * parse_xor(Parser *parser)

{
  Token *op;
  void *right;
  Token *tok;
  void *left;
  Parser *parser_local;
  
  tok = (Token *)parse_and(parser);
  while (parser->token->kind == XOR) {
    op = parser->token;
    move(parser);
    right = parse_and(parser);
    tok = (Token *)new_binary_expr(tok,op,right);
  }
  return tok;
}

Assistant:

void *parse_xor(Parser *parser) {
    void *left = parse_and(parser);
    Token *tok = token(parser);
    while (token(parser)->kind == XOR) {
        tok = token(parser);
        move(parser);
        left = new_binary_expr(left, tok, parse_and(parser));
    }
    return left;
}